

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O0

char * humanSize(curl_off_t bytes)

{
  double local_48;
  double dblBytes;
  int i;
  char length;
  char *suffix [5];
  curl_off_t bytes_local;
  
  suffix[4] = (char *)bytes;
  memcpy(&i,&DAT_00110d30,0x28);
  dblBytes._0_4_ = 0;
  local_48 = (double)(long)suffix[4];
  if (0x400 < (long)suffix[4]) {
    dblBytes._0_4_ = 0;
    for (; 0 < (long)suffix[4] / 0x400 && dblBytes._0_4_ < 4;
        suffix[4] = (char *)((long)suffix[4] / 0x400)) {
      local_48 = (double)(long)suffix[4] / 1024.0;
      dblBytes._0_4_ = dblBytes._0_4_ + 1;
    }
  }
  sprintf(humanSize::output,"%.02lf %s",local_48,*(undefined8 *)(&i + (long)dblBytes._0_4_ * 2));
  return humanSize::output;
}

Assistant:

static const char *humanSize(curl_off_t bytes) {
    char const *suffix[] = {"B", "KB", "MB", "GB", "TB"};
    char length = sizeof(suffix) / sizeof(suffix[0]);

    int i = 0;
    double dblBytes = bytes;

    if (bytes > 1024) {
        for (i = 0; (bytes / 1024) > 0 && i < length - 1; i++, bytes /= 1024)
            dblBytes = bytes / 1024.0;
    }

    static char output[200];
    sprintf(output, "%.02lf %s", dblBytes, suffix[i]);
    return output;
}